

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase154::run(TestCase154 *this)

{
  StructDataBitCount *this_00;
  double dVar1;
  Builder builder_00;
  Reader reader;
  Reader reader_00;
  undefined1 uVar2;
  uint32_t uVar3;
  char *pcVar4;
  ArrayPtr<const_capnp::word> data;
  ArrayPtr<const_capnp::word> data_00;
  undefined8 in_stack_fffffffffffffd70;
  undefined7 in_stack_fffffffffffffd78;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  ArrayPtr<const_capnp::word> local_220;
  Reader local_210;
  bool local_1d9;
  double dStack_1d8;
  bool _kj_shouldLog_2;
  double local_1d0;
  bool local_1c5;
  uint32_t local_1c4;
  int iStack_1c0;
  bool _kj_shouldLog_1;
  bool local_1b9;
  SegmentBuilder *pSStack_1b8;
  bool _kj_shouldLog;
  SegmentBuilder *pSStack_1b0;
  CapTableBuilder *local_1a8;
  void *pvStack_1a0;
  WirePointer *local_198;
  ArrayPtr<const_capnp::word> local_188;
  undefined1 local_178 [8];
  Reader copy;
  undefined1 auStack_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase154 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)auStack_128,(MessageBuilder *)this_00);
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt32Field((Builder *)auStack_128,0x7b);
  capnproto_test::capnp::test::TestAllTypes::Builder::setFloat64Field((Builder *)auStack_128,1.5);
  Text::Reader::Reader((Reader *)&copy._reader.nestingLimit,"foo");
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField
            ((Builder *)auStack_128,(Reader)stack0xfffffffffffffeb8);
  local_198 = root._builder.pointers;
  local_1a8 = root._builder.capTable;
  pvStack_1a0 = root._builder.data;
  pSStack_1b8 = (SegmentBuilder *)auStack_128;
  pSStack_1b0 = root._builder.segment;
  builder_00._builder.capTable = root._builder.capTable;
  builder_00._builder.segment = root._builder.segment;
  builder_00._builder.data = root._builder.data;
  builder_00._builder.pointers = root._builder.pointers;
  builder_00._builder.dataSize = (int)in_stack_fffffffffffffd70;
  builder_00._builder.pointerCount = (short)((ulong)in_stack_fffffffffffffd70 >> 0x20);
  builder_00._builder._38_2_ = (short)((ulong)in_stack_fffffffffffffd70 >> 0x30);
  local_188 = writeDataStruct<capnproto_test::capnp::test::TestAllTypes::Builder>(builder_00);
  data.ptr = (word *)local_188.size_;
  data.size_ = (size_t)local_188.ptr;
  readDataStruct<capnproto_test::capnp::test::TestAllTypes>
            ((Reader *)local_178,(capnp *)local_188.ptr,data);
  uVar3 = capnproto_test::capnp::test::TestAllTypes::Reader::getUInt32Field((Reader *)local_178);
  pcVar4 = (char *)(ulong)uVar3;
  if (uVar3 != 0x7b) {
    local_1b9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1b9 != false) {
      iStack_1c0 = 0x7b;
      local_1c4 = capnproto_test::capnp::test::TestAllTypes::Reader::getUInt32Field
                            ((Reader *)local_178);
      pcVar4 = 
      "\"failed: expected \" \"(123) == (copy.getUInt32Field())\", 123, copy.getUInt32Field()";
      kj::_::Debug::log<char_const(&)[50],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
                 ,0xa3,ERROR,
                 "\"failed: expected \" \"(123) == (copy.getUInt32Field())\", 123, copy.getUInt32Field()"
                 ,(char (*) [50])"failed: expected (123) == (copy.getUInt32Field())",
                 &stack0xfffffffffffffe40,&local_1c4);
      local_1b9 = false;
    }
  }
  dVar1 = capnproto_test::capnp::test::TestAllTypes::Reader::getFloat64Field((Reader *)local_178);
  if ((dVar1 != 1.5) || (NAN(dVar1))) {
    local_1c5 = kj::_::Debug::shouldLog(ERROR);
    while (local_1c5 != false) {
      local_1d0 = 1.5;
      dStack_1d8 = capnproto_test::capnp::test::TestAllTypes::Reader::getFloat64Field
                             ((Reader *)local_178);
      pcVar4 = 
      "\"failed: expected \" \"(1.5) == (copy.getFloat64Field())\", 1.5, copy.getFloat64Field()";
      kj::_::Debug::log<char_const(&)[51],double,double>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
                 ,0xa4,ERROR,
                 "\"failed: expected \" \"(1.5) == (copy.getFloat64Field())\", 1.5, copy.getFloat64Field()"
                 ,(char (*) [51])"failed: expected (1.5) == (copy.getFloat64Field())",&local_1d0,
                 &stack0xfffffffffffffe28);
      local_1c5 = false;
    }
  }
  uVar2 = capnproto_test::capnp::test::TestAllTypes::Reader::hasTextField((Reader *)local_178);
  if ((bool)uVar2) {
    local_1d9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1d9 != false) {
      pcVar4 = "\"failed: expected \" \"!(copy.hasTextField())\"";
      kj::_::Debug::log<char_const(&)[40]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
                 ,0xa5,ERROR,"\"failed: expected \" \"!(copy.hasTextField())\"",
                 (char (*) [40])"failed: expected !(copy.hasTextField())");
      local_1d9 = false;
    }
  }
  kj::ArrayPtr<const_capnp::word>::ArrayPtr(&local_220,(void *)0x0);
  data_00.size_ = (size_t)pcVar4;
  data_00.ptr = (word *)local_220.size_;
  readDataStruct<capnproto_test::capnp::test::TestAllTypes>
            (&local_210,(capnp *)local_220.ptr,data_00);
  reader._reader.capTable = (CapTableReader *)local_210._reader.data;
  reader._reader.segment = (SegmentReader *)local_210._reader.capTable;
  reader._reader.data = local_210._reader.pointers;
  reader._reader.pointers = (WirePointer *)local_210._reader._32_8_;
  reader._reader.dataSize = local_210._reader.nestingLimit;
  reader._reader.pointerCount = local_210._reader._44_2_;
  reader._reader._38_2_ = local_210._reader._46_2_;
  reader._reader._40_7_ = in_stack_fffffffffffffd78;
  reader._reader._47_1_ = uVar2;
  checkTestMessageAllZero(reader);
  defaultValue<capnproto_test::capnp::test::TestAllTypes>();
  reader_00._reader.capTable = (CapTableReader *)local_240;
  reader_00._reader.segment = (SegmentReader *)uStack_248;
  reader_00._reader.data = (void *)uStack_238;
  reader_00._reader.pointers = (WirePointer *)local_230;
  reader_00._reader._32_8_ = uStack_228;
  reader_00._reader._40_7_ = in_stack_fffffffffffffd78;
  reader_00._reader._47_1_ = uVar2;
  checkTestMessageAllZero(reader_00);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Message, ReadWriteDataStruct) {
  MallocMessageBuilder builder;
  auto root = builder.getRoot<TestAllTypes>();

  root.setUInt32Field(123);
  root.setFloat64Field(1.5);
  root.setTextField("foo");

  auto copy = readDataStruct<TestAllTypes>(writeDataStruct(root));
  EXPECT_EQ(123, copy.getUInt32Field());
  EXPECT_EQ(1.5, copy.getFloat64Field());
  EXPECT_FALSE(copy.hasTextField());

  checkTestMessageAllZero(readDataStruct<TestAllTypes>(nullptr));
  checkTestMessageAllZero(defaultValue<TestAllTypes>());
}